

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_stq_env_A0(DisasContext *s,int offset)

{
  TCGContext *tcg_ctx_00;
  TCGContext *tcg_ctx;
  int offset_local;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  tcg_gen_ld_i64_x86_64(tcg_ctx_00,s->tmp1_i64,tcg_ctx_00->cpu_env,(long)offset);
  tcg_gen_qemu_st_i64_x86_64(tcg_ctx_00,s->tmp1_i64,s->A0,(long)s->mem_index,MO_64);
  return;
}

Assistant:

static inline void gen_stq_env_A0(DisasContext *s, int offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    tcg_gen_ld_i64(tcg_ctx, s->tmp1_i64, tcg_ctx->cpu_env, offset);
    tcg_gen_qemu_st_i64(tcg_ctx, s->tmp1_i64, s->A0, s->mem_index, MO_LEQ);
}